

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line-parser.cpp
# Opt level: O0

void license::printHelpHeader(char *prog_name)

{
  string *psVar1;
  ostream *poVar2;
  path local_50;
  path local_30;
  value_type *local_10;
  char *prog_name_local;
  
  local_10 = prog_name;
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  boost::filesystem::path::path(&local_50,local_10);
  boost::filesystem::path::filename();
  psVar1 = boost::filesystem::path::string_abi_cxx11_(&local_30);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)psVar1);
  poVar2 = std::operator<<(poVar2," Version ");
  poVar2 = std::operator<<(poVar2,"");
  poVar2 = std::operator<<(poVar2,". Usage:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  boost::filesystem::path::~path(&local_30);
  boost::filesystem::path::~path(&local_50);
  return;
}

Assistant:

static void printHelpHeader(const char *prog_name) {
	cout << endl;
	cout << fs::path(prog_name).filename().string() << " Version " << PROJECT_VERSION << ". Usage:" << endl;
}